

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::EnumDescriptor::DebugString
          (EnumDescriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options)

{
  int i;
  int i_00;
  size_t sVar1;
  long lVar2;
  long lVar3;
  SubstituteArg local_2e8;
  SubstituteArg local_2b8;
  SubstituteArg local_288;
  SubstituteArg local_258;
  SubstituteArg local_228;
  SubstituteArg local_1f8;
  string prefix;
  SubstituteArg local_1a8;
  SubstituteArg local_178;
  SubstituteArg local_148;
  SubstituteArg local_118;
  string local_e8;
  SourceLocationCommentPrinter comment_printer;
  
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  std::__cxx11::string::_M_construct((ulong)&prefix,(char)depth * '\x02');
  comment_printer.source_loc_.leading_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.leading_comments.field_2;
  comment_printer.source_loc_.leading_comments._M_string_length = 0;
  comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.trailing_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.trailing_comments.field_2;
  comment_printer.source_loc_.trailing_comments._M_string_length = 0;
  comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  comment_printer.options_.include_comments = debug_string_options->include_comments;
  comment_printer.options_.elide_group_body = debug_string_options->elide_group_body;
  comment_printer.options_.elide_oneof_body = debug_string_options->elide_oneof_body;
  comment_printer.prefix_._M_dataplus._M_p = (pointer)&comment_printer.prefix_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&comment_printer.prefix_,prefix._M_dataplus._M_p,
             prefix._M_dataplus._M_p +
             CONCAT44(prefix._M_string_length._4_4_,(int)prefix._M_string_length));
  if (debug_string_options->include_comments == true) {
    comment_printer.have_source_loc_ = GetSourceLocation(this,&comment_printer.source_loc_);
  }
  else {
    comment_printer.have_source_loc_ = false;
  }
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment(&comment_printer,contents);
  local_1a8.text_ = prefix._M_dataplus._M_p;
  local_1a8.size_ = (int)prefix._M_string_length;
  local_178.text_ = (char *)**(undefined8 **)(this + 8);
  local_178.size_ = *(int *)(*(undefined8 **)(this + 8) + 1);
  local_118.text_ = (char *)0x0;
  local_118.size_ = -1;
  local_148.text_ = (char *)0x0;
  local_148.size_ = -1;
  local_2b8.text_ = (char *)0x0;
  local_2b8.size_ = -1;
  local_2e8.text_ = (char *)0x0;
  local_2e8.size_ = -1;
  local_1f8.text_ = (char *)0x0;
  local_1f8.size_ = -1;
  local_228.text_ = (char *)0x0;
  local_228.size_ = -1;
  local_258.text_ = (char *)0x0;
  local_258.size_ = -1;
  local_288.text_ = (char *)0x0;
  local_288.size_ = -1;
  strings::SubstituteAndAppend
            (contents,"$0enum $1 {\n",&local_1a8,&local_178,&local_118,&local_148,&local_2b8,
             &local_2e8,&local_1f8,&local_228,&local_258,&local_288);
  anon_unknown_1::FormatLineOptions
            (depth + 1,*(Message **)(this + 0x20),
             *(DescriptorPool **)(*(long *)(this + 0x10) + 0x10),contents);
  if (0 < *(int *)(this + 4)) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      EnumValueDescriptor::DebugString
                ((EnumValueDescriptor *)(*(long *)(this + 0x28) + lVar3),depth + 1,contents,
                 debug_string_options);
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x20;
    } while (lVar2 < *(int *)(this + 4));
  }
  if (0 < *(int *)(this + 0x30)) {
    local_1a8.text_ = prefix._M_dataplus._M_p;
    local_1a8.size_ = (int)prefix._M_string_length;
    local_178.text_ = (char *)0x0;
    local_178.size_ = -1;
    local_118.text_ = (char *)0x0;
    local_118.size_ = -1;
    local_148.text_ = (char *)0x0;
    local_148.size_ = -1;
    local_2b8.text_ = (char *)0x0;
    local_2b8.size_ = -1;
    local_2e8.text_ = (char *)0x0;
    local_2e8.size_ = -1;
    local_1f8.text_ = (char *)0x0;
    local_1f8.size_ = -1;
    local_228.text_ = (char *)0x0;
    local_228.size_ = -1;
    local_258.text_ = (char *)0x0;
    local_258.size_ = -1;
    local_288.text_ = (char *)0x0;
    local_288.size_ = -1;
    strings::SubstituteAndAppend
              (contents,"$0  reserved ",&local_1a8,&local_178,&local_118,&local_148,&local_2b8,
               &local_2e8,&local_1f8,&local_228,&local_258,&local_288);
    if (0 < *(int *)(this + 0x30)) {
      lVar2 = 0;
      do {
        lVar3 = *(long *)(this + 0x38);
        i = *(int *)(lVar3 + lVar2 * 8);
        i_00 = *(int *)(lVar3 + 4 + lVar2 * 8);
        if (i_00 == i) {
          local_1a8.text_ = FastInt32ToBuffer(i_00,local_1a8.scratch_);
          sVar1 = strlen(local_1a8.text_);
          local_1a8.size_ = (int)sVar1;
          local_178.text_ = (char *)0x0;
          local_178.size_ = -1;
          local_118.text_ = (char *)0x0;
          local_118.size_ = -1;
          local_148.text_ = (char *)0x0;
          local_148.size_ = -1;
          local_2b8.text_ = (char *)0x0;
          local_2b8.size_ = -1;
          local_2e8.text_ = (char *)0x0;
          local_2e8.size_ = -1;
          local_1f8.text_ = (char *)0x0;
          local_1f8.size_ = -1;
          local_228.text_ = (char *)0x0;
          local_228.size_ = -1;
          local_258.text_ = (char *)0x0;
          local_258.size_ = -1;
          local_288.text_ = (char *)0x0;
          local_288.size_ = -1;
          strings::SubstituteAndAppend
                    (contents,"$0, ",&local_1a8,&local_178,&local_118,&local_148,&local_2b8,
                     &local_2e8,&local_1f8,&local_228,&local_258,&local_288);
        }
        else if (i_00 == 0x7fffffff) {
          local_1a8.text_ = FastInt32ToBuffer(i,local_1a8.scratch_);
          sVar1 = strlen(local_1a8.text_);
          local_1a8.size_ = (int)sVar1;
          local_178.text_ = (char *)0x0;
          local_178.size_ = -1;
          local_118.text_ = (char *)0x0;
          local_118.size_ = -1;
          local_148.text_ = (char *)0x0;
          local_148.size_ = -1;
          local_2b8.text_ = (char *)0x0;
          local_2b8.size_ = -1;
          local_2e8.text_ = (char *)0x0;
          local_2e8.size_ = -1;
          local_1f8.text_ = (char *)0x0;
          local_1f8.size_ = -1;
          local_228.text_ = (char *)0x0;
          local_228.size_ = -1;
          local_258.text_ = (char *)0x0;
          local_258.size_ = -1;
          local_288.text_ = (char *)0x0;
          local_288.size_ = -1;
          strings::SubstituteAndAppend
                    (contents,"$0 to max, ",&local_1a8,&local_178,&local_118,&local_148,&local_2b8,
                     &local_2e8,&local_1f8,&local_228,&local_258,&local_288);
        }
        else {
          local_1a8.text_ = FastInt32ToBuffer(i,local_1a8.scratch_);
          sVar1 = strlen(local_1a8.text_);
          local_1a8.size_ = (int)sVar1;
          local_178.text_ = FastInt32ToBuffer(*(int32 *)(lVar3 + 4 + lVar2 * 8),local_178.scratch_);
          sVar1 = strlen(local_178.text_);
          local_178.size_ = (int)sVar1;
          local_118.text_ = (char *)0x0;
          local_118.size_ = -1;
          local_148.text_ = (char *)0x0;
          local_148.size_ = -1;
          local_2b8.text_ = (char *)0x0;
          local_2b8.size_ = -1;
          local_2e8.text_ = (char *)0x0;
          local_2e8.size_ = -1;
          local_1f8.text_ = (char *)0x0;
          local_1f8.size_ = -1;
          local_228.text_ = (char *)0x0;
          local_228.size_ = -1;
          local_258.text_ = (char *)0x0;
          local_258.size_ = -1;
          local_288.text_ = (char *)0x0;
          local_288.size_ = -1;
          strings::SubstituteAndAppend
                    (contents,"$0 to $1, ",&local_1a8,&local_178,&local_118,&local_148,&local_2b8,
                     &local_2e8,&local_1f8,&local_228,&local_258,&local_288);
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < *(int *)(this + 0x30));
    }
    std::__cxx11::string::replace
              ((ulong)contents,contents->_M_string_length - 2,(char *)0x2,0x405ef6);
  }
  if (0 < *(int *)(this + 0x34)) {
    local_1a8.text_ = prefix._M_dataplus._M_p;
    local_1a8.size_ = (int)prefix._M_string_length;
    local_178.text_ = (char *)0x0;
    local_178.size_ = -1;
    local_118.text_ = (char *)0x0;
    local_118.size_ = -1;
    local_148.text_ = (char *)0x0;
    local_148.size_ = -1;
    local_2b8.text_ = (char *)0x0;
    local_2b8.size_ = -1;
    local_2e8.text_ = (char *)0x0;
    local_2e8.size_ = -1;
    local_1f8.text_ = (char *)0x0;
    local_1f8.size_ = -1;
    local_228.text_ = (char *)0x0;
    local_228.size_ = -1;
    local_258.text_ = (char *)0x0;
    local_258.size_ = -1;
    local_288.text_ = (char *)0x0;
    local_288.size_ = -1;
    strings::SubstituteAndAppend
              (contents,"$0  reserved ",&local_1a8,&local_178,&local_118,&local_148,&local_2b8,
               &local_2e8,&local_1f8,&local_228,&local_258,&local_288);
    if (0 < *(int *)(this + 0x34)) {
      lVar2 = 0;
      do {
        CEscape(&local_e8,*(string **)(*(long *)(this + 0x40) + lVar2 * 8));
        local_1a8.text_ = local_e8._M_dataplus._M_p;
        local_1a8.size_ = (int)local_e8._M_string_length;
        local_178.text_ = (char *)0x0;
        local_178.size_ = -1;
        local_118.text_ = (char *)0x0;
        local_118.size_ = -1;
        local_148.text_ = (char *)0x0;
        local_148.size_ = -1;
        local_2b8.text_ = (char *)0x0;
        local_2b8.size_ = -1;
        local_2e8.text_ = (char *)0x0;
        local_2e8.size_ = -1;
        local_1f8.text_ = (char *)0x0;
        local_1f8.size_ = -1;
        local_228.text_ = (char *)0x0;
        local_228.size_ = -1;
        local_258.text_ = (char *)0x0;
        local_258.size_ = -1;
        local_288.text_ = (char *)0x0;
        local_288.size_ = -1;
        strings::SubstituteAndAppend
                  (contents,"\"$0\", ",&local_1a8,&local_178,&local_118,&local_148,&local_2b8,
                   &local_2e8,&local_1f8,&local_228,&local_258,&local_288);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < *(int *)(this + 0x34));
    }
    std::__cxx11::string::replace
              ((ulong)contents,contents->_M_string_length - 2,(char *)0x2,0x405ef6);
  }
  local_1a8.text_ = prefix._M_dataplus._M_p;
  local_1a8.size_ = (int)prefix._M_string_length;
  local_178.text_ = (char *)0x0;
  local_178.size_ = -1;
  local_118.text_ = (char *)0x0;
  local_118.size_ = -1;
  local_148.text_ = (char *)0x0;
  local_148.size_ = -1;
  local_2b8.text_ = (char *)0x0;
  local_2b8.size_ = -1;
  local_2e8.text_ = (char *)0x0;
  local_2e8.size_ = -1;
  local_1f8.text_ = (char *)0x0;
  local_1f8.size_ = -1;
  local_228.text_ = (char *)0x0;
  local_228.size_ = -1;
  local_258.text_ = (char *)0x0;
  local_258.size_ = -1;
  local_288.text_ = (char *)0x0;
  local_288.size_ = -1;
  strings::SubstituteAndAppend
            (contents,"$0}\n",&local_1a8,&local_178,&local_118,&local_148,&local_2b8,&local_2e8,
             &local_1f8,&local_228,&local_258,&local_288);
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment(&comment_printer,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.prefix_._M_dataplus._M_p != &comment_printer.prefix_.field_2) {
    operator_delete(comment_printer.prefix_._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&comment_printer.source_loc_.leading_detached_comments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.source_loc_.trailing_comments._M_dataplus._M_p !=
      &comment_printer.source_loc_.trailing_comments.field_2) {
    operator_delete(comment_printer.source_loc_.trailing_comments._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.source_loc_.leading_comments._M_dataplus._M_p !=
      &comment_printer.source_loc_.leading_comments.field_2) {
    operator_delete(comment_printer.source_loc_.leading_comments._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prefix._M_dataplus._M_p != &prefix.field_2) {
    operator_delete(prefix._M_dataplus._M_p);
  }
  return;
}

Assistant:

void EnumDescriptor::DebugString(
    int depth, std::string* contents,
    const DebugStringOptions& debug_string_options) const {
  std::string prefix(depth * 2, ' ');
  ++depth;

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  strings::SubstituteAndAppend(contents, "$0enum $1 {\n", prefix, name());

  FormatLineOptions(depth, options(), file()->pool(), contents);

  for (int i = 0; i < value_count(); i++) {
    value(i)->DebugString(depth, contents, debug_string_options);
  }

  if (reserved_range_count() > 0) {
    strings::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_range_count(); i++) {
      const EnumDescriptor::ReservedRange* range = reserved_range(i);
      if (range->end == range->start) {
        strings::SubstituteAndAppend(contents, "$0, ", range->start);
      } else if (range->end == INT_MAX) {
        strings::SubstituteAndAppend(contents, "$0 to max, ", range->start);
      } else {
        strings::SubstituteAndAppend(contents, "$0 to $1, ", range->start,
                                  range->end);
      }
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  if (reserved_name_count() > 0) {
    strings::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_name_count(); i++) {
      strings::SubstituteAndAppend(contents, "\"$0\", ",
                                CEscape(reserved_name(i)));
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  strings::SubstituteAndAppend(contents, "$0}\n", prefix);

  comment_printer.AddPostComment(contents);
}